

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O2

Token * __thiscall
inja::Lexer::scan_body
          (Token *__return_storage_ptr__,Lexer *this,string_view close,Kind closeKind,
          string_view close_trim,bool trim)

{
  string_view *this_00;
  ulong uVar1;
  byte bVar2;
  MinusState MVar3;
  Kind kind;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  
  this_00 = &this->m_in;
  sVar6 = this->tok_start;
LAB_00149a1b:
  if (this_00->_M_len <= sVar6) {
    kind = Eof;
LAB_00149aaa:
    make_token(__return_storage_ptr__,this,kind);
    return __return_storage_ptr__;
  }
  bVar2 = (this->m_in)._M_str[sVar6];
  if (((ulong)bVar2 < 0x21) && ((0x100002200U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
  goto LAB_00149a9c;
  if (close_trim._M_len != 0) {
    bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (this_00,sVar6,0xffffffffffffffff);
    bVar4 = string_view::starts_with(bVar7,close_trim);
    sVar6 = this->tok_start;
    if (bVar4) {
      this->state = Text;
      this->pos = sVar6 + close_trim._M_len;
      make_token(__return_storage_ptr__,this,closeKind);
      skip_whitespaces_and_newlines(this);
      return __return_storage_ptr__;
    }
  }
  bVar7 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    (this_00,sVar6,0xffffffffffffffff);
  bVar4 = string_view::starts_with(bVar7,close);
  if (bVar4) {
    this->state = Text;
    this->pos = close._M_len + this->tok_start;
    make_token(__return_storage_ptr__,this,closeKind);
    if (!trim) {
      return __return_storage_ptr__;
    }
    skip_whitespaces_and_first_newline(this);
    return __return_storage_ptr__;
  }
  if (bVar2 == 10) {
    sVar6 = this->tok_start;
    goto LAB_00149a9c;
  }
  sVar6 = this->tok_start;
  uVar1 = sVar6 + 1;
  this->pos = uVar1;
  iVar5 = isalpha((int)(char)bVar2);
  if (iVar5 != 0) {
switchD_00149b8f_caseD_24:
    this->minus_state = Operator;
    scan_id(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  }
  MVar3 = this->minus_state;
  if (MVar3 == Operator) {
    this->minus_state = Number;
  }
  switch(bVar2) {
  case 0x21:
    if ((uVar1 < this_00->_M_len) && ((this->m_in)._M_str[uVar1] == '=')) {
      this->pos = sVar6 + 2;
      kind = NotEqual;
      goto LAB_00149aaa;
    }
    break;
  case 0x22:
    scan_string(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x23:
  case 0x26:
  case 0x27:
  case 0x3b:
  case 0x3f:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4c:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5c:
    break;
  case 0x24:
  case 0x40:
  case 0x5f:
    goto switchD_00149b8f_caseD_24;
  case 0x25:
    kind = Percent;
    goto LAB_00149aaa;
  case 0x28:
    kind = LeftParen;
    goto LAB_00149aaa;
  case 0x29:
    this->minus_state = Operator;
    kind = RightParen;
    goto LAB_00149aaa;
  case 0x2a:
    kind = Times;
    goto LAB_00149aaa;
  case 0x2b:
    kind = Plus;
    goto LAB_00149aaa;
  case 0x2c:
    kind = Comma;
    goto LAB_00149aaa;
  case 0x2d:
    if (MVar3 != Operator) goto LAB_00149b96;
    kind = Minus;
    goto LAB_00149aaa;
  case 0x2e:
    kind = Dot;
    goto LAB_00149aaa;
  case 0x2f:
    kind = Slash;
    goto LAB_00149aaa;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    this->minus_state = Operator;
LAB_00149b96:
    scan_number(__return_storage_ptr__,this);
    return __return_storage_ptr__;
  case 0x3a:
    kind = Colon;
    goto LAB_00149aaa;
  case 0x3c:
    if ((uVar1 < this_00->_M_len) && ((this->m_in)._M_str[uVar1] == '=')) {
      this->pos = sVar6 + 2;
      kind = LessEqual;
    }
    else {
      kind = LessThan;
    }
    goto LAB_00149aaa;
  case 0x3d:
    if ((uVar1 < this_00->_M_len) && ((this->m_in)._M_str[uVar1] == '=')) {
      this->pos = sVar6 + 2;
      kind = Equal;
      goto LAB_00149aaa;
    }
    break;
  case 0x3e:
    if ((uVar1 < this_00->_M_len) && ((this->m_in)._M_str[uVar1] == '=')) {
      this->pos = sVar6 + 2;
      kind = GreaterEqual;
    }
    else {
      kind = GreaterThan;
    }
    goto LAB_00149aaa;
  case 0x5b:
    kind = LeftBracket;
    goto LAB_00149aaa;
  case 0x5d:
    this->minus_state = Operator;
    kind = RightBracket;
    goto LAB_00149aaa;
  case 0x5e:
    kind = Power;
    goto LAB_00149aaa;
  default:
    if (bVar2 == 0x7b) {
      kind = LeftBrace;
      goto LAB_00149aaa;
    }
    if (bVar2 == 0x7d) {
      this->minus_state = Operator;
      kind = RightBrace;
      goto LAB_00149aaa;
    }
  }
  kind = Unknown;
  goto LAB_00149aaa;
LAB_00149a9c:
  sVar6 = sVar6 + 1;
  this->tok_start = sVar6;
  goto LAB_00149a1b;
}

Assistant:

Token scan_body(std::string_view close, Token::Kind closeKind, std::string_view close_trim = std::string_view(), bool trim = false) {
  again:
    // skip whitespace (except for \n as it might be a close)
    if (tok_start >= m_in.size()) {
      return make_token(Token::Kind::Eof);
    }
    const char ch = m_in[tok_start];
    if (ch == ' ' || ch == '\t' || ch == '\r') {
      tok_start += 1;
      goto again;
    }

    // check for close
    if (!close_trim.empty() && inja::string_view::starts_with(m_in.substr(tok_start), close_trim)) {
      state = State::Text;
      pos = tok_start + close_trim.size();
      const Token tok = make_token(closeKind);
      skip_whitespaces_and_newlines();
      return tok;
    }

    if (inja::string_view::starts_with(m_in.substr(tok_start), close)) {
      state = State::Text;
      pos = tok_start + close.size();
      const Token tok = make_token(closeKind);
      if (trim) {
        skip_whitespaces_and_first_newline();
      }
      return tok;
    }

    // skip \n
    if (ch == '\n') {
      tok_start += 1;
      goto again;
    }

    pos = tok_start + 1;
    if (std::isalpha(ch)) {
      minus_state = MinusState::Operator;
      return scan_id();
    }

    const MinusState current_minus_state = minus_state;
    if (minus_state == MinusState::Operator) {
      minus_state = MinusState::Number;
    }

    switch (ch) {
    case '+':
      return make_token(Token::Kind::Plus);
    case '-':
      if (current_minus_state == MinusState::Operator) {
        return make_token(Token::Kind::Minus);
      }
      return scan_number();
    case '*':
      return make_token(Token::Kind::Times);
    case '/':
      return make_token(Token::Kind::Slash);
    case '^':
      return make_token(Token::Kind::Power);
    case '%':
      return make_token(Token::Kind::Percent);
    case '.':
      return make_token(Token::Kind::Dot);
    case ',':
      return make_token(Token::Kind::Comma);
    case ':':
      return make_token(Token::Kind::Colon);
    case '(':
      return make_token(Token::Kind::LeftParen);
    case ')':
      minus_state = MinusState::Operator;
      return make_token(Token::Kind::RightParen);
    case '[':
      return make_token(Token::Kind::LeftBracket);
    case ']':
      minus_state = MinusState::Operator;
      return make_token(Token::Kind::RightBracket);
    case '{':
      return make_token(Token::Kind::LeftBrace);
    case '}':
      minus_state = MinusState::Operator;
      return make_token(Token::Kind::RightBrace);
    case '>':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::GreaterEqual);
      }
      return make_token(Token::Kind::GreaterThan);
    case '<':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::LessEqual);
      }
      return make_token(Token::Kind::LessThan);
    case '=':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::Equal);
      }
      return make_token(Token::Kind::Unknown);
    case '!':
      if (pos < m_in.size() && m_in[pos] == '=') {
        pos += 1;
        return make_token(Token::Kind::NotEqual);
      }
      return make_token(Token::Kind::Unknown);
    case '\"':
      return scan_string();
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      minus_state = MinusState::Operator;
      return scan_number();
    case '_':
    case '@':
    case '$':
      minus_state = MinusState::Operator;
      return scan_id();
    default:
      return make_token(Token::Kind::Unknown);
    }
  }